

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O3

void CheckFrame(TidyDocImpl *doc,Node *node)

{
  int *piVar1;
  TidyAttrId TVar2;
  bool bVar3;
  Bool BVar4;
  uint uVar5;
  tmbstr str;
  ctmbstr cp;
  char *pcVar6;
  AttVal *pAVar7;
  
  piVar1 = &(doc->access).numFrames;
  *piVar1 = *piVar1 + 1;
  if ((doc->access).PRIORITYCHK - 4U < 0xfffffffd) {
    return;
  }
  pAVar7 = node->attributes;
  if (pAVar7 != (AttVal *)0x0) {
    bVar3 = false;
    do {
      if (pAVar7->dict != (Attribute *)0x0) {
        TVar2 = pAVar7->dict->id;
        if (TVar2 == TidyAttr_TITLE) {
          pcVar6 = pAVar7->value;
          if (pcVar6 == (char *)0x0) {
LAB_00151e02:
            if (!bVar3) {
              if ((pAVar7->value == (ctmbstr)0x0) ||
                 (uVar5 = prvTidytmbstrlen(pAVar7->value), uVar5 == 0)) {
                uVar5 = 0x300;
LAB_00151e65:
                prvTidyReportAccessError(doc,node,uVar5);
                goto LAB_00151e6a;
              }
              pcVar6 = pAVar7->value;
              if (pcVar6 == (char *)0x0) {
                str = (ctmbstr)0x0;
LAB_00151e51:
                uVar5 = prvTidytmbstrlen(str);
                if (uVar5 != 0) {
                  uVar5 = 0x301;
                  goto LAB_00151e65;
                }
                bVar3 = false;
              }
              else {
                do {
                  if (*pcVar6 == '\0') {
                    str = pAVar7->value;
                    goto LAB_00151e51;
                  }
                  BVar4 = prvTidyIsWhite((int)*pcVar6);
                  pcVar6 = pcVar6 + 1;
                  bVar3 = false;
                } while (BVar4 != no);
              }
            }
          }
          else {
            do {
              if (*pcVar6 == '\0') goto LAB_00151e02;
              BVar4 = prvTidyIsWhite((int)*pcVar6);
              pcVar6 = pcVar6 + 1;
            } while (BVar4 != no);
LAB_00151e6a:
            bVar3 = true;
          }
        }
        else if (TVar2 == TidyAttr_SRC) {
          pcVar6 = pAVar7->value;
          if (pcVar6 != (char *)0x0) {
            do {
              if (*pcVar6 == '\0') goto LAB_00151e70;
              BVar4 = prvTidyIsWhite((int)*pcVar6);
              pcVar6 = pcVar6 + 1;
            } while (BVar4 != no);
            BVar4 = IsValidSrcExtension(pAVar7->value);
            if (BVar4 == no) {
              prvTidyReportAccessError(doc,node,0x2d4);
            }
          }
        }
        else if ((TVar2 == TidyAttr_LONGDESC) && (pcVar6 = pAVar7->value, pcVar6 != (char *)0x0)) {
          do {
            if (*pcVar6 == '\0') goto LAB_00151e70;
            BVar4 = prvTidyIsWhite((int)*pcVar6);
            pcVar6 = pcVar6 + 1;
          } while (BVar4 != no);
          uVar5 = prvTidytmbstrlen(pAVar7->value);
          if (1 < uVar5) {
            piVar1 = &(doc->access).HasCheckedLongDesc;
            *piVar1 = *piVar1 + 1;
          }
        }
      }
LAB_00151e70:
      pAVar7 = pAVar7->next;
    } while (pAVar7 != (AttVal *)0x0);
    if (bVar3) goto LAB_00151e98;
  }
  prvTidyReportAccessError(doc,node,0x2ff);
LAB_00151e98:
  if (((doc->access).numFrames == 3) && ((doc->access).HasCheckedLongDesc < 3)) {
    (doc->access).numFrames = 0;
    prvTidyReportAccessError(doc,node,0x2a6);
    return;
  }
  return;
}

Assistant:

static void CheckFrame( TidyDocImpl* doc, Node* node )
{
    Bool HasTitle = no;
    AttVal* av;

    doc->access.numFrames++;

    if (Level1_Enabled( doc ))
    {
        /* Checks for attributes within the FRAME element */
        for (av = node->attributes; av != NULL; av = av->next)
        {
            /* Checks if 'LONGDESC' value is valid only if present */
            if ( attrIsLONGDESC(av) )
            {
                if ( hasValue(av) && TY_(tmbstrlen)(av->value) > 1 )
                {
                    doc->access.HasCheckedLongDesc++;
                }
            }

            /* Checks for valid 'SRC' value within the frame element */
            else if ( attrIsSRC(av) )
            {
                if ( hasValue(av) && !IsValidSrcExtension(av->value) )
                {
                    TY_(ReportAccessError)( doc, node, FRAME_SRC_INVALID );
                }
            }

            /* Checks for valid 'TITLE' value within frame element */
            else if ( attrIsTITLE(av) )
            {
                if ( hasValue(av) )
                    HasTitle = yes;

                if ( !HasTitle )
                {
                    if ( av->value == NULL || TY_(tmbstrlen)(av->value) == 0 )
                    {
                        HasTitle = yes;
                        TY_(ReportAccessError)( doc, node, FRAME_TITLE_INVALID_NULL);
                    }
                    else
                    {
                        if ( IsWhitespace(av->value) && TY_(tmbstrlen)(av->value) > 0 )
                        {
                            HasTitle = yes;
                            TY_(ReportAccessError)( doc, node, FRAME_TITLE_INVALID_SPACES );
                        }
                    }
                }
            }
        }

        if ( !HasTitle )
        {
            TY_(ReportAccessError)( doc, node, FRAME_MISSING_TITLE);
        }

        if ( doc->access.numFrames==3 && doc->access.HasCheckedLongDesc<3 )
        {
            doc->access.numFrames = 0;
            TY_(ReportAccessError)( doc, node, FRAME_MISSING_LONGDESC );
        }
    }
}